

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineMultipleRead.cpp
# Opt level: O1

void testDeepScanLineMultipleRead(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  undefined4 *puVar8;
  int *piVar9;
  long lVar10;
  ostream *poVar11;
  int range;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  float fVar18;
  uint sample_count;
  float *sample_ptr;
  _Base_ptr p_Stack_180;
  _Base_ptr local_178;
  DeepScanLineOutputFile file;
  _Base_ptr local_158;
  float sample;
  string source_filename;
  vector<unsigned_int,_std::allocator<unsigned_int>_> samplecounts;
  Header header;
  DeepFrameBuffer fb;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting random re-reads from deep scanline file:\n",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  source_filename._M_dataplus._M_p = (pointer)&source_filename.field_2;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&source_filename,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&source_filename);
  random_reseed(1);
  _Var4 = source_filename._M_dataplus;
  fb._map._M_t._M_impl._0_8_ = 0;
  Imf_3_2::Header::Header(&header,4,0x30,1.0,(Vec2 *)&fb,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar7 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&fb,FLOAT,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar7,(Channel *)0x1ca849);
  puVar8 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar8 = 2;
  Imf_3_2::Header::setType((string *)&header);
  remove(_Var4._M_p);
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineOutputFile::DeepScanLineOutputFile(&file,_Var4._M_p,&header,iVar5);
  sample_ptr = &sample;
  p_Var1 = &fb._map._M_t._M_impl.super__Rb_tree_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_2::Slice::Slice(&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice((Slice *)&samplecounts,UINT,(char *)&sample_count,0,0,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)&samplecounts,FLOAT,(char *)&sample_ptr,0,0,0,1,1,0.0,false,false);
  Imf_3_2::DeepFrameBuffer::insert((char *)&fb,(DeepSlice *)0x1ca849);
  Imf_3_2::DeepScanLineOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  uVar13 = 0;
  do {
    sample = (float)(int)(uVar13 + 100);
    sample_count = uVar13;
    Imf_3_2::DeepScanLineOutputFile::writePixels((int)&file);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x30);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&fb);
  Imf_3_2::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
  Imf_3_2::Header::~Header(&header);
  _Var4 = source_filename._M_dataplus;
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepScanLineInputFile::DeepScanLineInputFile
            ((DeepScanLineInputFile *)&sample_count,_Var4._M_p,iVar5);
  Imf_3_2::DeepScanLineInputFile::header();
  piVar9 = (int *)Imf_3_2::Header::dataWindow();
  iVar5 = *piVar9;
  iVar2 = piVar9[1];
  iVar6 = piVar9[2];
  iVar12 = piVar9[3];
  iVar14 = 0;
  if (iVar2 <= iVar12 && iVar5 <= iVar6) {
    iVar14 = iVar6 - iVar5;
  }
  range = 1;
  if (iVar2 <= iVar12 && iVar5 <= iVar6) {
    range = (iVar12 - iVar2) + 1;
  }
  Imf_3_2::DeepScanLineInputFile::header();
  Imf_3_2::Header::channels();
  lVar10 = Imf_3_2::ChannelList::begin();
  uVar13 = iVar14 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&samplecounts,(long)(int)uVar13,(allocator_type *)&fb);
  std::vector<float_*,_std::allocator<float_*>_>::vector
            ((vector<float_*,_std::allocator<float_*>_> *)&file,(long)(int)uVar13,
             (allocator_type *)&fb);
  local_178 = (_Base_ptr)0x0;
  sample_ptr = (float *)0x0;
  p_Stack_180 = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_2::Slice::Slice(&fb._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_2::Slice::Slice
            ((Slice *)&header,UINT,
             (char *)(samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + -(long)iVar5),4,0,1,1,0.0,false,
             false);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&fb);
  Imf_3_2::DeepSlice::DeepSlice
            ((DeepSlice *)&header,FLOAT,(char *)((long)iVar5 * -8 + (long)_file),8,0,4,1,1,0.0,false
             ,false);
  Imf_3_2::DeepFrameBuffer::insert((char *)&fb,(DeepSlice *)(lVar10 + 0x20));
  Imf_3_2::DeepScanLineInputFile::setFrameBuffer((DeepFrameBuffer *)&sample_count);
  iVar5 = 0;
  do {
    iVar6 = random_int(range);
    uVar16 = iVar6 + iVar2;
    Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts((int)&sample_count,uVar16);
    if (iVar14 < 0) {
      uVar17 = 0;
    }
    else {
      uVar15 = 0;
      uVar17 = 0;
      do {
        if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] != uVar16) {
          poVar11 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11," error, sample counts should be ",0x20);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,", is ",5);
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::ostream::flush();
        }
        if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar15] != uVar16) {
          __assert_fail("samplecounts[i] == static_cast<unsigned int> (row)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineMultipleRead.cpp"
                        ,0x9b,"void (anonymous namespace)::read_file(const char *)");
        }
        uVar17 = (ulong)((int)uVar17 +
                        samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar15]);
        uVar15 = uVar15 + 1;
      } while (uVar13 != uVar15);
    }
    iVar6 = (int)uVar17;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&sample_ptr,(long)iVar6);
    if ((-1 < iVar14) && (0 < iVar6)) {
      lVar10 = 0;
      iVar12 = 0;
      do {
        *(float **)((long)_file + lVar10 * 8) = sample_ptr + iVar12;
        if (iVar14 <= lVar10) break;
        iVar12 = iVar12 + samplecounts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar12 < iVar6);
    }
    Imf_3_2::DeepScanLineInputFile::readPixels((int)&sample_count,uVar16);
    if (0 < iVar6) {
      fVar18 = (float)(int)uVar16 + 100.0;
      uVar15 = 0;
      do {
        if ((sample_ptr[uVar15] != fVar18) || (NAN(sample_ptr[uVar15]) || NAN(fVar18))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sample ",8);
          poVar11 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," on row ",8);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,uVar16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," error, shuold be ",0x12);
          poVar11 = std::ostream::_M_insert<double>((double)fVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," got ",5);
          poVar11 = std::ostream::_M_insert<double>((double)sample_ptr[uVar15]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
          std::ostream::put((char)poVar11);
          std::ostream::flush();
          std::ostream::flush();
        }
        if ((sample_ptr[uVar15] != fVar18) || (NAN(sample_ptr[uVar15]) || NAN(fVar18))) {
          __assert_fail("samples[i] == row + 100.f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineMultipleRead.cpp"
                        ,0xbe,"void (anonymous namespace)::read_file(const char *)");
        }
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
    }
    iVar5 = iVar5 + 1;
    if (iVar5 == 4000) {
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                   *)&fb);
      if (sample_ptr != (float *)0x0) {
        operator_delete(sample_ptr,(long)local_178 - (long)sample_ptr);
      }
      if (_file != (void *)0x0) {
        operator_delete(_file,(long)local_158 - (long)_file);
      }
      if (samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(samplecounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)samplecounts.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)samplecounts.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Imf_3_2::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&sample_count)
      ;
      remove(source_filename._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ok\n",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      std::ostream::put('X');
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)source_filename._M_dataplus._M_p != &source_filename.field_2) {
        operator_delete(source_filename._M_dataplus._M_p,
                        source_filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
testDeepScanLineMultipleRead (const std::string& tempDir)
{

    cout << "\n\nTesting random re-reads from deep scanline file:\n" << endl;

    std::string source_filename = tempDir + "imf_test_multiple_read";
    random_reseed (1);

    make_file (source_filename.c_str ());
    read_file (source_filename.c_str ());
    remove (source_filename.c_str ());

    cout << " ok\n" << endl;
}